

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralComparators.hpp
# Opt level: O0

void __thiscall
Kernel::LiteralComparators::NormalizedLinearComparatorByWeight<false>::
~NormalizedLinearComparatorByWeight(NormalizedLinearComparatorByWeight<false> *this)

{
  LiteralComparator *in_RDI;
  
  LiteralComparator::~LiteralComparator(in_RDI);
  return;
}

Assistant:

Comparison compare(Term* t1, Term* t2)
  {
    ASS_EQ(t1->isLiteral(), t2->isLiteral());

    if(t1->weight()!=t2->weight()) {
      return Int::compare(t1->weight(),t2->weight());
    }
    if(t1->functor()!=t2->functor()) {
      return Int::compare(t1->functor(),t2->functor());
    }
    if(t1->isLiteral() && !ignorePolarity &&
	    static_cast<Literal*>(t1)->polarity()!=static_cast<Literal*>(t2)->polarity()) {
      return Int::compare(static_cast<Literal*>(t1)->polarity(),
	      static_cast<Literal*>(t2)->polarity());
    }

    // MR: this looked suspicious to me, but MS says...
    //
    // t1 and t2 are assumed to be distinct initially,
    // so this is an attempt to alpha-normalize them,
    // before some further comparisons
    if(t1->isLiteral() && t1->functor() == 0) {
      t1=Renaming::normalize(static_cast<Literal*>(t1));
      t2=Renaming::normalize(static_cast<Literal*>(t2));

      if(t1==t2) {
	return EQUAL;
      }
    }

    static DHMap<unsigned, unsigned> firstNums;
    static DHMap<unsigned, unsigned> secondNums;
    firstNums.reset();
    secondNums.reset();

    DisagreementSetIterator dsit(t1,t2,true);
    while(dsit.hasNext()) {
      std::pair<TermList, TermList> dis=dsit.next();
      if(dis.first.isTerm()) {
	if(dis.second.isTerm()) {
	  ASS_NEQ(dis.first.term()->functor(), dis.second.term()->functor());
	  return Int::compare(dis.first.term()->functor(), dis.second.term()->functor());
	}
	return GREATER;
      }
      if(dis.second.isTerm()) {
	return LESS;
      }
      int firstNorm=firstNums.findOrInsert(dis.first.var(), firstNums.size());
      int secondNorm=secondNums.findOrInsert(dis.second.var(), secondNums.size());
      if(firstNorm!=secondNorm) {
	return Int::compare(secondNorm, firstNorm);
      }
    }
    //they're variants of each other
    return EQUAL;
  }